

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::api::anon_unknown_1::PipelineLayout::create
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  long lVar1;
  ulong uVar2;
  VkPipelineLayoutCreateInfo pipelineLayoutInfo;
  
  pipelineLayoutInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutInfo.pNext = (void *)0x0;
  pipelineLayoutInfo.flags = 0;
  pipelineLayoutInfo.pSetLayouts =
       (res->pSetLayouts).
       super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(res->pSetLayouts).
                super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pipelineLayoutInfo.pSetLayouts;
  if (uVar2 == 0) {
    pipelineLayoutInfo.pSetLayouts = (VkDescriptorSetLayout *)(pointer)0x0;
  }
  pipelineLayoutInfo.setLayoutCount = (deUint32)(uVar2 >> 3);
  pipelineLayoutInfo.pPushConstantRanges =
       (params->pushConstantRanges).
       super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl
       .super__Vector_impl_data._M_start;
  lVar1 = (long)(params->pushConstantRanges).
                super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)pipelineLayoutInfo.pPushConstantRanges;
  if (lVar1 == 0) {
    pipelineLayoutInfo.pPushConstantRanges = (pointer)0x0;
  }
  pipelineLayoutInfo.pushConstantRangeCount = (deUint32)(lVar1 / 0xc);
  ::vk::createPipelineLayout
            (__return_storage_ptr__,env->vkd,env->device,&pipelineLayoutInfo,
             env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkPipelineLayout> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkPipelineLayoutCreateInfo	pipelineLayoutInfo	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkPipelineLayoutCreateFlags)0,
			(deUint32)res.pSetLayouts.size(),
			(res.pSetLayouts.empty() ? DE_NULL : &res.pSetLayouts[0]),
			(deUint32)params.pushConstantRanges.size(),
			(params.pushConstantRanges.empty() ? DE_NULL : &params.pushConstantRanges[0]),
		};

		return createPipelineLayout(env.vkd, env.device, &pipelineLayoutInfo, env.allocationCallbacks);
	}